

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O3

void __thiscall
double_conversion::Bignum::AssignPowerUInt16(Bignum *this,uint16_t base,int power_exponent)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint factor;
  bool bVar10;
  
  uVar5 = (ulong)base;
  if (power_exponent == 0) {
    this->used_bigits_ = 1;
    this->exponent_ = 0;
    this->bigits_buffer_[0] = 1;
    return;
  }
  this->used_bigits_ = 0;
  this->exponent_ = 0;
  if ((base & 1) == 0) {
    iVar9 = 0;
    do {
      uVar5 = uVar5 >> 1;
      iVar9 = iVar9 + 1;
      factor = (uint)uVar5;
    } while ((uVar5 & 1) == 0);
  }
  else {
    factor = (uint)base;
    iVar9 = 0;
  }
  uVar1 = 0x1f;
  if (factor != 0) {
    for (; factor >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  if (0xde3 < (int)((0x20 - (uVar1 ^ 0x1f)) * power_exponent)) {
    abort();
  }
  uVar8 = 1;
  do {
    uVar6 = uVar8;
    uVar8 = uVar6 * 2;
  } while ((int)uVar6 <= power_exponent);
  uVar8 = (int)uVar6 >> 2;
  uVar4 = uVar5;
  if (uVar6 < 4) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    uVar6 = uVar8;
    do {
      uVar4 = uVar4 * uVar4;
      if ((uVar6 & power_exponent) != 0) {
        bVar10 = uVar4 >> ((byte)(uVar1 ^ 0x1f) & 0x3f | 0x20) != 0;
        uVar7 = 1;
        if (!bVar10) {
          uVar7 = uVar5;
        }
        uVar4 = uVar4 * uVar7;
        bVar2 = (bool)(bVar2 | bVar10);
      }
      uVar8 = (int)uVar6 >> 1;
    } while ((1 < uVar6) && (uVar6 = uVar8, uVar4 >> 0x20 == 0));
  }
  if (uVar4 != 0) {
    lVar3 = 0;
    do {
      this->bigits_buffer_[lVar3] = (uint)uVar4 & 0xfffffff;
      lVar3 = lVar3 + 1;
      bVar10 = 0xfffffff < uVar4;
      uVar4 = uVar4 >> 0x1c;
    } while (bVar10);
    this->used_bigits_ = (int16_t)lVar3;
  }
  if (bVar2) {
    MultiplyByUInt32(this,factor);
  }
  if (uVar8 != 0) {
    do {
      Square(this);
      if ((uVar8 & power_exponent) != 0) {
        MultiplyByUInt32(this,factor);
      }
      bVar2 = 1 < uVar8;
      uVar8 = (int)uVar8 >> 1;
    } while (bVar2);
  }
  ShiftLeft(this,iVar9 * power_exponent);
  return;
}

Assistant:

void Bignum::AssignPowerUInt16(uint16_t base, const int power_exponent) {
  DOUBLE_CONVERSION_ASSERT(base != 0);
  DOUBLE_CONVERSION_ASSERT(power_exponent >= 0);
  if (power_exponent == 0) {
    AssignUInt16(1);
    return;
  }
  Zero();
  int shifts = 0;
  // We expect base to be in range 2-32, and most often to be 10.
  // It does not make much sense to implement different algorithms for counting
  // the bits.
  while ((base & 1) == 0) {
    base >>= 1;
    shifts++;
  }
  int bit_size = 0;
  int tmp_base = base;
  while (tmp_base != 0) {
    tmp_base >>= 1;
    bit_size++;
  }
  const int final_size = bit_size * power_exponent;
  // 1 extra bigit for the shifting, and one for rounded final_size.
  EnsureCapacity(final_size / kBigitSize + 2);

  // Left to Right exponentiation.
  int mask = 1;
  while (power_exponent >= mask) mask <<= 1;

  // The mask is now pointing to the bit above the most significant 1-bit of
  // power_exponent.
  // Get rid of first 1-bit;
  mask >>= 2;
  uint64_t this_value = base;

  bool delayed_multiplication = false;
  const uint64_t max_32bits = 0xFFFFFFFF;
  while (mask != 0 && this_value <= max_32bits) {
    this_value = this_value * this_value;
    // Verify that there is enough space in this_value to perform the
    // multiplication.  The first bit_size bits must be 0.
    if ((power_exponent & mask) != 0) {
      DOUBLE_CONVERSION_ASSERT(bit_size > 0);
      const uint64_t base_bits_mask =
        ~((static_cast<uint64_t>(1) << (64 - bit_size)) - 1);
      const bool high_bits_zero = (this_value & base_bits_mask) == 0;
      if (high_bits_zero) {
        this_value *= base;
      } else {
        delayed_multiplication = true;
      }
    }
    mask >>= 1;
  }
  AssignUInt64(this_value);
  if (delayed_multiplication) {
    MultiplyByUInt32(base);
  }

  // Now do the same thing as a bignum.
  while (mask != 0) {
    Square();
    if ((power_exponent & mask) != 0) {
      MultiplyByUInt32(base);
    }
    mask >>= 1;
  }

  // And finally add the saved shifts.
  ShiftLeft(shifts * power_exponent);
}